

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O0

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  undefined8 uVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  uint b;
  uint g;
  uint r;
  RTCOccludedArguments sargs;
  Ray shadow;
  Vec3fa lightDir;
  Vec3fa diffuse;
  Vec3fa color;
  RTCIntersectArguments iargs;
  Ray ray;
  float t;
  uint32_t state;
  __m128 c_4;
  __m128 r_3;
  __m128 a_4;
  __m128 c_1;
  __m128 r_1;
  __m128 a_1;
  __m128 c_3;
  __m128 r_2;
  __m128 a_3;
  vint4 mask_4;
  vint4 mask_3;
  vint4 mask_1;
  vint4 mask;
  __m128 mask_2;
  vfloat4 c_5;
  vfloat4 b_3;
  vfloat4 a_5;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  vfloat4 c;
  vfloat4 b_1;
  vfloat4 a;
  float local_21d0;
  float local_21cc;
  float local_21c8;
  float local_21c4;
  float local_21c0;
  float local_21bc;
  float local_21b8;
  float local_21b4;
  undefined4 local_2108;
  undefined4 local_2104;
  undefined8 local_2100;
  undefined8 local_20f8;
  undefined8 local_20f0;
  undefined1 local_20e8 [8];
  ulong uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  ulong uStack_20c0;
  undefined8 local_20b8;
  ulong uStack_20b0;
  undefined8 local_20a8;
  ulong uStack_20a0;
  undefined1 local_2098 [8];
  ulong uStack_2090;
  float local_2088;
  undefined4 local_2084;
  undefined1 auStack_2078 [20];
  undefined4 local_2064;
  undefined4 local_2060;
  undefined4 local_205c;
  undefined4 local_2058;
  undefined8 local_2048;
  undefined8 uStack_2040;
  float local_2038;
  float fStack_2034;
  ulong uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  float local_2018;
  float fStack_2014;
  ulong uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  float local_1ff8;
  float fStack_1ff4;
  ulong uStack_1ff0;
  undefined4 local_1fe8;
  undefined4 local_1fe4;
  undefined8 local_1fe0;
  undefined8 local_1fd8;
  undefined8 local_1fd0;
  undefined8 local_1fc8;
  ulong uStack_1fc0;
  undefined8 local_1fb8;
  ulong uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  ulong uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  ulong uStack_1f50;
  undefined8 local_1f48;
  ulong uStack_1f40;
  undefined8 local_1f38;
  ulong uStack_1f30;
  undefined8 local_1f28;
  ulong uStack_1f20;
  float local_1f18;
  undefined4 local_1f14;
  float local_1f08;
  float local_1f04;
  float local_1f00;
  uint local_1ef4;
  int local_1ef0;
  undefined4 local_1eec;
  undefined4 local_1ee8;
  float local_1ecc;
  uint32_t local_1ec8;
  int local_1ebc;
  long local_1eb8;
  int local_1eb0;
  int local_1eac;
  long local_1ea8;
  undefined4 local_1e9c;
  undefined4 local_1e98;
  undefined4 local_1e94;
  undefined8 *local_1e90;
  float *local_1e78;
  float *local_1e70;
  undefined4 local_1e64;
  float *local_1e60;
  undefined8 *local_1e58;
  undefined8 *local_1e50;
  undefined8 *local_1e40;
  undefined8 *local_1e38;
  undefined8 *local_1e30;
  undefined8 *local_1e28;
  undefined8 *local_1e20;
  undefined8 *local_1e08;
  float *local_1e00;
  undefined8 *local_1df8;
  undefined8 *local_1df0;
  undefined8 *local_1dd0;
  float *local_1dc8;
  float *local_1dc0;
  undefined8 *local_1db8;
  undefined8 *local_1db0;
  undefined8 *local_1da8;
  undefined8 *local_1da0;
  undefined8 *local_1d98;
  undefined8 *local_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 *local_1d70;
  float local_1d64;
  undefined8 *local_1d60;
  float local_1d54;
  undefined8 *local_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 *local_1d38;
  float local_1d2c;
  undefined8 *local_1d28;
  float local_1d1c;
  undefined8 *local_1d18;
  undefined1 *local_1d10;
  undefined1 *local_1d08;
  undefined4 local_1d00;
  undefined4 local_1cfc;
  undefined4 local_1cf8;
  float local_1cf4;
  float local_1cf0;
  undefined4 local_1cec;
  undefined8 *local_1ce8;
  undefined8 *local_1ce0;
  undefined8 *local_1cd8;
  undefined4 local_1cd0;
  undefined4 local_1ccc;
  undefined4 local_1cc8;
  float local_1cc4;
  float local_1cc0;
  undefined4 local_1cbc;
  undefined1 *local_1cb8;
  undefined8 *local_1cb0;
  undefined8 *local_1ca8;
  undefined4 *local_1ca0;
  undefined8 *local_1c98;
  int *local_1c90;
  undefined8 *local_1c88;
  undefined8 *local_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  float local_1c5c;
  undefined8 *local_1c58;
  undefined8 *local_1c50;
  float local_1c44;
  undefined8 *local_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  float local_1c1c;
  undefined8 *local_1c18;
  float *local_1c10;
  float local_1c04;
  undefined8 *local_1c00;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined4 local_1ba4;
  undefined8 *local_1ba0;
  undefined8 *local_1b98;
  undefined4 local_1b8c;
  undefined8 *local_1b88;
  undefined8 *local_1b80;
  undefined8 *local_1b78;
  undefined8 *local_1b70;
  undefined1 local_1b68 [16];
  undefined8 *local_1b58;
  float local_1b4c;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  undefined8 *local_1b38;
  float *local_1b30;
  undefined1 *local_1b28;
  undefined4 *local_1b20;
  undefined8 *local_1b18;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 *local_1a98;
  undefined8 *local_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 *local_1a78;
  undefined8 *local_1a70;
  undefined8 local_1a08;
  ulong uStack_1a00;
  undefined4 local_19f8;
  undefined4 local_19f4;
  float local_19f0;
  undefined4 local_19ec;
  undefined8 local_19e8;
  ulong uStack_19e0;
  undefined4 local_19d8;
  undefined4 local_19d4;
  uint local_19d0;
  undefined4 local_19cc;
  undefined8 local_19c8;
  ulong uStack_19c0;
  undefined4 local_19b8;
  undefined4 local_19b4;
  uint local_19b0;
  undefined4 local_19ac;
  undefined8 local_19a8;
  ulong uStack_19a0;
  undefined4 local_1998;
  undefined4 local_1994;
  uint local_1990;
  undefined4 local_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined4 uStack_1964;
  undefined4 uStack_1960;
  undefined4 uStack_195c;
  undefined4 local_194c;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  float local_190c;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  float local_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  float local_18cc;
  float local_18c8;
  float fStack_18c4;
  float fStack_18c0;
  float fStack_18bc;
  float local_18ac;
  undefined4 local_18a8;
  undefined4 uStack_18a4;
  undefined4 uStack_18a0;
  undefined4 uStack_189c;
  undefined4 local_1898;
  ulong local_1848;
  undefined8 uStack_1840;
  undefined1 local_1838 [16];
  ulong local_1828;
  undefined8 uStack_1820;
  float local_180c;
  ulong local_1808;
  undefined8 uStack_1800;
  undefined1 local_17f8 [16];
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined4 local_17cc;
  undefined1 local_17c8 [16];
  undefined4 local_17ac;
  undefined1 local_17a8 [16];
  undefined4 local_178c;
  undefined1 local_1788 [16];
  undefined4 local_176c;
  undefined1 local_1768 [16];
  undefined4 local_174c;
  undefined1 local_1748 [16];
  undefined4 local_172c;
  undefined1 local_1728 [16];
  float local_170c;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  ulong local_1698;
  undefined8 uStack_1690;
  ulong local_1678;
  undefined8 uStack_1670;
  ulong local_1668;
  undefined8 uStack_1660;
  ulong local_1658;
  undefined8 uStack_1650;
  ulong local_1648;
  undefined8 uStack_1640;
  undefined8 local_1618;
  undefined8 uStack_1610;
  ulong local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  ulong local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  ulong local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  ulong local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  ulong local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  ulong local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  ulong local_14e8;
  undefined8 uStack_14e0;
  float local_1458;
  ulong local_1438;
  undefined8 uStack_1430;
  ulong local_1428;
  undefined8 uStack_1420;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  ulong uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  float fStack_1370;
  undefined8 local_1368;
  ulong uStack_1360;
  undefined8 *local_1350;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  undefined8 *local_1330;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  undefined8 *local_1310;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  float *local_12f0;
  undefined8 *local_12a0;
  undefined8 *local_1298;
  undefined8 *local_1290;
  undefined4 local_1288;
  undefined4 uStack_1284;
  undefined4 uStack_1280;
  undefined4 uStack_127c;
  undefined8 *local_1278;
  undefined8 *local_1270;
  undefined8 *local_1268;
  undefined8 *local_1260;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  undefined8 *local_1248;
  undefined8 *local_1240;
  undefined8 *local_1238;
  undefined8 *local_1230;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 *local_1218;
  undefined8 *local_11e0;
  undefined8 *local_11d8;
  float *local_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined8 *local_1188;
  undefined8 *local_1180;
  undefined8 *local_1178;
  undefined8 *local_1170;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined8 *local_1158;
  undefined8 *local_1150;
  undefined8 *local_1148;
  undefined8 *local_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 *local_1120;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined8 local_1108;
  undefined8 uStack_1100;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  float fStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined1 local_fe8 [8];
  ulong uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined1 local_fc8 [8];
  ulong uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  float local_f9c;
  undefined1 *local_f98;
  undefined1 *local_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  ulong uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  ulong uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined4 local_f2c;
  undefined8 *local_f28;
  undefined8 *local_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  ulong uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  ulong uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  float local_ebc;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  ulong uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  ulong uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined4 local_e4c;
  undefined8 *local_e48;
  undefined8 *local_e40;
  undefined1 *local_e38;
  float *local_e30;
  undefined4 local_e28;
  undefined4 local_e24;
  undefined4 local_e20;
  undefined4 local_e1c;
  undefined8 *local_e18;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined8 *local_e00;
  undefined4 local_df8;
  undefined4 local_df4;
  undefined4 local_df0;
  undefined4 local_dec;
  undefined8 *local_de8;
  undefined4 local_de0;
  undefined4 local_ddc;
  undefined4 local_dd8;
  undefined4 local_dd4;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 *local_db8;
  undefined8 *local_db0;
  undefined8 *local_da8;
  undefined8 *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined8 *local_d88;
  undefined8 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 *local_d68;
  undefined1 *local_d60;
  undefined8 *local_d58;
  undefined1 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined8 *local_cf8;
  undefined8 *local_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 *local_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 *local_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 *local_c70;
  ulong uStack_c60;
  undefined1 *local_c50;
  undefined8 local_c48;
  ulong uStack_c40;
  undefined8 *local_c30;
  undefined8 local_c28;
  ulong uStack_c20;
  undefined8 *local_c10;
  undefined8 local_c08;
  ulong uStack_c00;
  undefined8 *local_bf0;
  undefined8 local_be8;
  ulong uStack_be0;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  ulong uStack_bc0;
  undefined8 *local_bb0;
  undefined8 local_ba8;
  ulong uStack_ba0;
  undefined8 *local_b90;
  ulong uStack_b80;
  undefined1 *local_b70;
  undefined4 local_b64;
  undefined8 *local_b60;
  undefined4 local_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 local_b48;
  float local_b44;
  undefined8 *local_b40;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  undefined4 local_b24;
  undefined8 *local_b20;
  undefined4 local_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 local_b08;
  float local_b04;
  undefined8 *local_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_adc;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 *local_ac8;
  undefined1 *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  float fStack_a2c;
  ulong uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  ulong uStack_a00;
  undefined8 local_9f8;
  ulong uStack_9f0;
  undefined8 local_9e8;
  ulong uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  ulong uStack_9c0;
  ulong uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  ulong uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  ulong uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  ulong uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined1 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined1 *local_818;
  undefined8 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  undefined8 *local_7d0;
  float local_7c4;
  undefined1 *local_7c0;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_79c;
  undefined8 local_798;
  undefined8 uStack_790;
  float *local_788;
  undefined1 *local_780;
  float local_778;
  float fStack_774;
  ulong uStack_770;
  undefined1 *local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined4 local_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined4 local_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  float local_708;
  float fStack_704;
  ulong uStack_700;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_108;
  undefined8 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_74;
  float local_70;
  
  local_1ebc = in_R8D;
  local_1eb8 = in_RCX;
  local_1eb0 = in_EDX;
  local_1eac = in_ESI;
  local_1ea8 = in_RDI;
  local_1ec8 = doodle(in_ESI + in_EDX * in_R8D);
  local_1ec8 = doodle(local_1ec8);
  local_1ecc = doodlef(0);
  local_1e58 = (undefined8 *)((long)in_stack_00000008 + 0x24);
  local_1990 = *(uint *)((long)in_stack_00000008 + 0x2c);
  local_1998 = *(undefined4 *)local_1e58;
  local_1994 = *(undefined4 *)(in_stack_00000008 + 5);
  local_19a8 = *local_1e58;
  local_198c = 0;
  uStack_19a0 = (ulong)local_1990;
  local_1d2c = (float)local_1eac;
  local_1e40 = &local_1f98;
  local_19b0 = *(uint *)(in_stack_00000008 + 1);
  local_19b8 = *(undefined4 *)in_stack_00000008;
  local_19b4 = *(undefined4 *)((long)in_stack_00000008 + 4);
  local_19c8 = *in_stack_00000008;
  local_19ac = 0;
  uStack_19c0 = (ulong)local_19b0;
  local_1d98 = &local_1f88;
  local_1d18 = &local_1d48;
  local_10e8 = CONCAT44(local_1d2c,local_1d2c);
  uStack_10e0 = CONCAT44(local_1d2c,local_1d2c);
  local_10f8 = (float)local_1f98;
  fStack_10f4 = (float)((ulong)local_1f98 >> 0x20);
  fStack_10f0 = (float)uStack_1f90;
  fStack_10ec = (float)(uStack_1f90 >> 0x20);
  local_1168 = local_1d2c * local_10f8;
  fStack_1164 = local_1d2c * fStack_10f4;
  fStack_1160 = local_1d2c * fStack_10f0;
  fStack_115c = local_1d2c * fStack_10ec;
  local_13d8 = CONCAT44(fStack_1164,local_1168);
  uStack_13d0 = CONCAT44(fStack_115c,fStack_1160);
  local_1d64 = (float)local_1eb0;
  local_1e38 = (undefined8 *)((long)in_stack_00000008 + 0xc);
  local_1e30 = &local_1fb8;
  local_19d0 = *(uint *)((long)in_stack_00000008 + 0x14);
  local_19d8 = *(undefined4 *)local_1e38;
  local_19d4 = *(undefined4 *)(in_stack_00000008 + 2);
  local_19e8 = *local_1e38;
  local_19cc = 0;
  uStack_19e0 = (ulong)local_19d0;
  local_1da0 = &local_1fa8;
  local_1d50 = &local_1d88;
  local_1108 = CONCAT44(local_1d64,local_1d64);
  uStack_1100 = CONCAT44(local_1d64,local_1d64);
  local_1118 = (float)local_1fb8;
  fStack_1114 = (float)((ulong)local_1fb8 >> 0x20);
  fStack_1110 = (float)uStack_1fb0;
  fStack_110c = (float)(uStack_1fb0 >> 0x20);
  local_1138 = local_1d64 * local_1118;
  fStack_1134 = local_1d64 * fStack_1114;
  fStack_1130 = local_1d64 * fStack_1110;
  fStack_112c = local_1d64 * fStack_110c;
  local_13e8 = CONCAT44(fStack_1134,local_1138);
  uStack_13e0 = CONCAT44(fStack_112c,fStack_1130);
  local_1db0 = &local_1f78;
  local_1348 = local_1168 + local_1138;
  fStack_1344 = fStack_1164 + fStack_1134;
  fStack_1340 = fStack_1160 + fStack_1130;
  fStack_133c = fStack_115c + fStack_112c;
  local_13b8 = CONCAT44(fStack_1344,local_1348);
  uStack_13b0 = CONCAT44(fStack_133c,fStack_1340);
  local_1e28 = in_stack_00000008 + 3;
  local_1e20 = &local_1fc8;
  local_19f0 = *(float *)(in_stack_00000008 + 4);
  local_19f8 = *(undefined4 *)local_1e28;
  local_19f4 = *(undefined4 *)((long)in_stack_00000008 + 0x1c);
  local_1a08 = *local_1e28;
  local_19ec = 0;
  uStack_1a00 = (ulong)(uint)local_19f0;
  local_1df8 = &local_1f68;
  local_13c8._0_4_ = (float)local_1a08;
  local_13c8._4_4_ = (float)((ulong)local_1a08 >> 0x20);
  local_1328 = local_1348 + (float)local_13c8;
  fStack_1324 = fStack_1344 + local_13c8._4_4_;
  fStack_1320 = fStack_1340 + local_19f0;
  fStack_131c = fStack_133c + 0.0;
  local_10c8 = CONCAT44(fStack_1324,local_1328);
  uStack_10c0 = CONCAT44(fStack_131c,fStack_1320);
  local_1260 = &local_1aa8;
  local_1258 = local_1328 * local_1328;
  fStack_1254 = fStack_1324 * fStack_1324;
  fStack_1250 = fStack_1320 * fStack_1320;
  fStack_124c = fStack_131c * fStack_131c;
  local_568 = CONCAT44(fStack_1254,local_1258);
  uStack_560 = CONCAT44(fStack_124c,fStack_1250);
  local_550 = &local_598;
  local_538 = &local_5a8;
  local_468 = CONCAT44(fStack_1254,fStack_1254);
  uStack_460 = CONCAT44(fStack_1254,fStack_1254);
  local_508 = &local_5b8;
  local_4c8 = CONCAT44(fStack_1250,fStack_1250);
  uStack_4c0 = CONCAT44(fStack_1250,fStack_1250);
  local_4d8 = &local_5d8;
  local_448 = local_1258 + fStack_1254;
  fStack_444 = fStack_1254 + fStack_1254;
  fStack_440 = fStack_1250 + fStack_1254;
  fStack_43c = fStack_124c + fStack_1254;
  local_4b8 = CONCAT44(fStack_444,local_448);
  uStack_4b0 = CONCAT44(fStack_43c,fStack_440);
  local_548 = &local_5c8;
  local_180c = local_448 + fStack_1250;
  fStack_4a4 = fStack_444 + fStack_1250;
  fStack_4a0 = fStack_440 + fStack_1250;
  fStack_49c = fStack_43c + fStack_1250;
  local_578 = CONCAT44(fStack_4a4,local_180c);
  uStack_570 = CONCAT44(fStack_49c,fStack_4a0);
  local_1728 = ZEXT416((uint)local_180c);
  local_1828 = CONCAT44(0,local_180c);
  uStack_1820 = 0;
  uStack_1690 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1828;
  local_1838 = rsqrtss(auVar3,auVar3);
  local_172c = 0x3fc00000;
  local_1748 = ZEXT416(0x3fc00000);
  local_14f8 = local_1838._0_8_;
  uVar1 = local_14f8;
  uStack_14f0 = local_1838._8_8_;
  local_14f8._0_4_ = local_1838._0_4_;
  local_14e8 = (ulong)(uint)((float)local_14f8 * 1.5);
  uStack_14e0 = 0;
  local_174c = 0xbf000000;
  local_1768 = ZEXT416(0xbf000000);
  local_1518 = local_1768._0_8_;
  uStack_1510 = 0;
  local_1508 = (ulong)(uint)(local_180c * -0.5);
  uStack_1500 = 0;
  local_1538 = local_1838._0_8_;
  uStack_1530 = local_1838._8_8_;
  local_1c5c = local_180c * -0.5 * (float)local_14f8;
  local_1528 = (ulong)(uint)local_1c5c;
  uStack_1520 = 0;
  local_1558 = local_1838._0_8_;
  uStack_1550 = local_1838._8_8_;
  local_1548 = CONCAT44(local_1838._4_4_,(float)local_14f8 * (float)local_14f8);
  uStack_1540 = local_1838._8_8_;
  local_1578 = local_1548;
  uStack_1570 = local_1838._8_8_;
  local_1c5c = local_1c5c * (float)local_14f8 * (float)local_14f8;
  local_1568 = (ulong)(uint)local_1c5c;
  uStack_1560 = 0;
  local_1658 = local_1568;
  uStack_1650 = 0;
  local_1c5c = (float)local_14f8 * 1.5 + local_1c5c;
  local_1648 = (ulong)(uint)local_1c5c;
  uStack_1640 = 0;
  local_1848 = local_1648;
  uStack_1840 = 0;
  local_1428 = local_1648;
  uStack_1420 = 0;
  local_1c40 = &local_1c78;
  local_10d8 = CONCAT44(local_1c5c,local_1c5c);
  uStack_10d0 = CONCAT44(local_1c5c,local_1c5c);
  local_1198 = local_1328 * local_1c5c;
  fStack_1194 = fStack_1324 * local_1c5c;
  fStack_1190 = fStack_1320 * local_1c5c;
  fStack_118c = fStack_131c * local_1c5c;
  local_1f58 = CONCAT44(fStack_1194,local_1198);
  uStack_1f50 = CONCAT44(fStack_118c,fStack_1190);
  local_1d08 = &inf;
  local_1e50 = &local_1f48;
  local_1df0 = &local_1f58;
  local_1db8 = local_1e20;
  local_1da8 = local_1df8;
  local_1d90 = local_1db0;
  local_1d70 = local_1e30;
  local_1d60 = local_1da0;
  local_1d54 = local_1d64;
  local_1d38 = local_1e40;
  local_1d28 = local_1d98;
  local_1d1c = local_1d2c;
  local_1c58 = local_1df8;
  local_1c50 = &local_1f58;
  local_1c44 = local_1c5c;
  local_1a98 = local_1df8;
  local_1a90 = local_1df8;
  local_1908 = local_1c5c;
  fStack_1904 = local_1c5c;
  fStack_1900 = local_1c5c;
  fStack_18fc = local_1c5c;
  local_18ec = local_1c5c;
  local_18e8 = local_1d2c;
  fStack_18e4 = local_1d2c;
  fStack_18e0 = local_1d2c;
  fStack_18dc = local_1d2c;
  local_18cc = local_1d2c;
  local_18c8 = local_1d64;
  fStack_18c4 = local_1d64;
  fStack_18c0 = local_1d64;
  fStack_18bc = local_1d64;
  local_18ac = local_1d64;
  local_170c = local_180c;
  local_1698 = local_1828;
  local_14f8 = uVar1;
  local_13c8 = local_1a08;
  uStack_13c0 = uStack_1a00;
  local_1330 = local_1db0;
  local_1310 = local_1df8;
  local_1270 = local_1df8;
  local_1268 = local_1df8;
  local_1248 = local_1260;
  local_11b0 = local_1c40;
  local_11a8 = local_1df8;
  local_11a0 = &local_1f58;
  local_1188 = &local_1f58;
  local_1180 = local_1e40;
  local_1178 = local_1d18;
  local_1170 = local_1d98;
  local_1158 = local_1d98;
  local_1150 = local_1e30;
  local_1148 = local_1d50;
  local_1140 = local_1da0;
  local_1120 = local_1da0;
  local_1058 = local_10c8;
  uStack_1050 = uStack_10c0;
  local_1048 = local_10c8;
  uStack_1040 = uStack_10c0;
  local_580 = local_1260;
  local_540 = local_550;
  local_510 = local_550;
  local_4e0 = local_508;
  local_4d0 = local_548;
  local_4a8 = local_180c;
  local_498 = local_548;
  local_490 = local_508;
  local_488 = local_4d8;
  local_480 = local_538;
  local_478 = local_550;
  local_470 = local_4d8;
  local_458 = local_568;
  uStack_450 = uStack_560;
  local_438 = local_4d8;
  local_430 = local_538;
  local_428 = local_550;
  local_218 = local_550;
  local_210 = local_538;
  local_208 = fStack_1254;
  fStack_204 = fStack_1254;
  fStack_200 = fStack_1254;
  fStack_1fc = fStack_1254;
  local_1f8 = local_468;
  uStack_1f0 = uStack_460;
  local_1e8 = local_538;
  local_1e0 = local_550;
  local_1d8 = local_568;
  uStack_1d0 = uStack_560;
  local_108 = local_550;
  local_100 = local_508;
  local_f8 = fStack_1250;
  fStack_f4 = fStack_1250;
  fStack_f0 = fStack_1250;
  fStack_ec = fStack_1250;
  local_e8 = local_4c8;
  uStack_e0 = uStack_4c0;
  local_d8 = local_508;
  local_d0 = local_550;
  local_c8 = local_568;
  uStack_c0 = uStack_560;
  local_1fc8 = local_1a08;
  uStack_1fc0 = uStack_1a00;
  local_1fb8 = local_19e8;
  uStack_1fb0 = uStack_19e0;
  local_1fa8 = local_13e8;
  uStack_1fa0 = uStack_13e0;
  local_1f98 = local_19c8;
  uStack_1f90 = uStack_19c0;
  local_1f88 = local_13d8;
  uStack_1f80 = uStack_13d0;
  local_1f78 = local_13b8;
  uStack_1f70 = uStack_13b0;
  local_1f68 = local_10c8;
  uStack_1f60 = uStack_10c0;
  local_1f48 = local_19a8;
  uStack_1f40 = uStack_19a0;
  local_1d88 = local_1108;
  uStack_1d80 = uStack_1100;
  local_1d48 = local_10e8;
  uStack_1d40 = uStack_10e0;
  local_1c78 = local_10d8;
  uStack_1c70 = uStack_10d0;
  local_1aa8 = local_568;
  uStack_1aa0 = uStack_560;
  local_5d8 = local_4b8;
  uStack_5d0 = uStack_4b0;
  local_5c8 = local_578;
  uStack_5c0 = uStack_570;
  local_5b8 = local_4c8;
  uStack_5b0 = uStack_4c0;
  local_5a8 = local_468;
  uStack_5a0 = uStack_460;
  local_598 = local_568;
  uStack_590 = uStack_560;
  local_1f18 = std::numeric_limits<float>::infinity();
  local_1cd8 = &local_1f38;
  local_1cec = 0;
  local_1cf4 = local_1ecc;
  local_1cf8 = 0xffffffff;
  local_1cfc = 0xffffffff;
  local_1d00 = 0xffffffff;
  local_e4c = 0;
  local_e18 = &local_e68;
  local_e1c = 0xffffffff;
  local_e20 = 0xffffffff;
  local_e24 = 0xffffffff;
  local_e28 = 0;
  local_a3c = 0;
  local_a40 = 0xffffffff;
  local_a44 = 0xffffffff;
  local_a48 = 0xffffffff;
  local_a58 = 0xffffffffffffffff;
  uStack_a50 = 0xffffffff;
  local_e68 = 0xffffffffffffffff;
  uStack_e60 = 0xffffffff;
  local_d48 = 0xffffffffffffffff;
  uStack_d40 = 0xffffffff;
  local_db8 = &local_e88;
  local_e88 = 0xffffffffffffffff;
  uStack_e80 = 0xffffffff;
  local_c08 = local_1f48;
  uStack_be0 = uStack_1f40;
  local_dc0 = &local_e98;
  local_dc8 = &local_ea8;
  local_b64 = 0;
  local_b48 = 0;
  local_b58 = 0;
  uStack_b54 = 0;
  uStack_b50 = 0;
  uStack_b4c = 0;
  local_858 = 0;
  uStack_850 = 0;
  local_db0 = &local_e78;
  local_948 = 0xffffffffffffffff;
  uStack_940 = 0xffffffff;
  uStack_c00 = uStack_1f40 & 0xffffffff;
  local_848 = 0xffffffffffffffff;
  uStack_840 = 0xffffffff;
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_eb0 = &local_1f28;
  local_ebc = local_1ecc;
  local_e00 = &local_ed8;
  local_e04 = 0xffffffff;
  local_e08 = 0xffffffff;
  local_e0c = 0xffffffff;
  local_e10 = 0;
  local_a5c = 0;
  local_a60 = 0xffffffff;
  local_a64 = 0xffffffff;
  local_a68 = 0xffffffff;
  local_a78 = 0xffffffffffffffff;
  uStack_a70 = 0xffffffff;
  local_ed8 = 0xffffffffffffffff;
  uStack_ed0 = 0xffffffff;
  local_d38 = 0xffffffffffffffff;
  uStack_d30 = 0xffffffff;
  local_d98 = &local_ef8;
  local_ef8 = 0xffffffffffffffff;
  uStack_ef0 = 0xffffffff;
  local_c28 = local_1f58;
  uStack_bc0 = uStack_1f50;
  local_da0 = &local_f08;
  local_da8 = &local_f18;
  local_b44 = local_1ecc;
  local_b28 = local_1ecc;
  local_b38 = local_1ecc;
  fStack_b34 = local_1ecc;
  fStack_b30 = local_1ecc;
  fStack_b2c = local_1ecc;
  local_878 = CONCAT44(local_1ecc,local_1ecc);
  uStack_870 = CONCAT44(local_1ecc,local_1ecc);
  local_d90 = &local_ee8;
  local_968 = 0xffffffffffffffff;
  uStack_960 = 0xffffffff;
  uStack_9e0 = uStack_1f50 & 0xffffffff;
  local_868 = 0xffffffffffffffff;
  uStack_860 = 0xffffffff;
  local_9f8 = 0;
  uStack_9f0 = (ulong)(uint)local_1ecc << 0x20;
  uStack_c20 = uStack_9e0 | uStack_9f0;
  local_1f14 = 0xffffffff;
  local_e30 = &local_1f08;
  local_1ef4 = 0xffffffff;
  local_1ef0 = -1;
  local_1eec = 0xffffffff;
  local_1ee8 = 0xffffffff;
  local_1ca0 = &local_1fe8;
  local_1fe8 = 0;
  local_1fe0 = 0;
  local_1fd8 = 0;
  local_1fd0 = 0;
  local_1fe4 = 3;
  local_1cf0 = local_1f18;
  local_1ce8 = &local_1f58;
  local_1ce0 = &local_1f48;
  local_1c98 = local_1cd8;
  local_eb8 = &local_1f58;
  local_e48 = &local_1f48;
  local_e40 = local_1cd8;
  local_d08 = local_e18;
  local_d00 = local_e00;
  local_ce8 = local_d48;
  uStack_ce0 = uStack_d40;
  local_cd0 = local_db8;
  local_cc8 = local_d38;
  uStack_cc0 = uStack_d30;
  local_cb0 = local_d98;
  local_c10 = local_d90;
  local_bf0 = local_db0;
  local_be8 = local_c08;
  local_bd0 = local_dc0;
  local_bc8 = local_c28;
  local_bb0 = local_da0;
  local_b60 = local_dc8;
  local_b40 = local_da8;
  local_ad8 = local_db0;
  local_ad0 = local_d90;
  local_9e8 = local_c28;
  local_9c8 = local_c08;
  uStack_9c0 = uStack_c00;
  local_978 = local_c28;
  uStack_970 = uStack_bc0;
  local_958 = local_c08;
  uStack_950 = uStack_be0;
  local_918 = local_d98;
  local_910 = local_d98;
  local_908 = local_db8;
  local_900 = local_db8;
  local_8d8 = local_da8;
  local_8d0 = local_da0;
  local_8c8 = local_dc8;
  local_8c0 = local_dc0;
  local_1f38 = local_c08;
  uStack_1f30 = uStack_c00;
  local_1f28 = local_c28;
  uStack_1f20 = uStack_c20;
  local_f18 = local_878;
  uStack_f10 = uStack_870;
  local_f08 = local_c28;
  uStack_f00 = uStack_bc0;
  local_ee8 = local_c28;
  uStack_ee0 = uStack_c20;
  local_ea8 = local_858;
  uStack_ea0 = uStack_850;
  local_e98 = local_c08;
  uStack_e90 = uStack_be0;
  local_e78 = local_c08;
  uStack_e70 = uStack_c00;
  rtcTraversableIntersect1(*(undefined8 *)(local_1ea8 + 8),local_1cd8);
  local_1c90 = in_stack_00000010;
  *in_stack_00000010 = *in_stack_00000010 + 1;
  local_1e60 = &local_1ff8;
  local_1e64 = 0;
  local_1898 = 0;
  local_18a8 = 0;
  uStack_18a4 = 0;
  uStack_18a0 = 0;
  uStack_189c = 0;
  local_1ff8 = 0.0;
  fStack_1ff4 = 0.0;
  uStack_1ff0._0_4_ = 0.0;
  if (local_1ef0 != -1) {
    local_1c88 = (undefined8 *)(*(long *)(local_1ea8 + 0x10) + (ulong)local_1ef4 * 0x10);
    local_1c80 = &local_2008;
    local_2008 = *local_1c88;
    uStack_2000 = local_1c88[1];
    local_1dd0 = &local_2028;
    local_1ba4 = 0x3f000000;
    local_1b88 = &local_1bb8;
    local_1b8c = 0x3f000000;
    local_194c = 0x3f000000;
    local_1968 = 0x3f000000;
    uStack_1964 = 0x3f000000;
    uStack_1960 = 0x3f000000;
    uStack_195c = 0x3f000000;
    local_1bb8 = 0x3f0000003f000000;
    uStack_1bb0 = 0x3f0000003f000000;
    local_1078 = 0x3f0000003f000000;
    uStack_1070 = 0x3f0000003f000000;
    local_1068._0_4_ = (float)local_2008;
    local_1068._4_4_ = (float)((ulong)local_2008 >> 0x20);
    uStack_1060._0_4_ = (float)uStack_2000;
    uStack_1060._4_4_ = (float)((ulong)uStack_2000 >> 0x20);
    local_1228 = (float)local_1068 * 0.5;
    fStack_1224 = local_1068._4_4_ * 0.5;
    fStack_1220 = (float)uStack_1060 * 0.5;
    fStack_121c = uStack_1060._4_4_ * 0.5;
    local_13a8 = CONCAT44(fStack_1224,local_1228);
    uStack_13a0 = CONCAT44(fStack_121c,fStack_1220);
    local_1e78 = &local_2018;
    local_1e70 = &local_1ff8;
    local_1398 = 0;
    uStack_1390 = 0;
    local_1308 = local_1228 + 0.0;
    fStack_1304 = fStack_1224 + 0.0;
    fStack_1300 = fStack_1220 + 0.0;
    fStack_12fc = fStack_121c + 0.0;
    uStack_2010 = CONCAT44(fStack_12fc,fStack_1300);
    local_1e90 = &local_2048;
    local_1e94 = 0xbf800000;
    local_1e98 = 0xbf800000;
    local_1e9c = 0xbf800000;
    local_196c = 0;
    local_1970 = 0xbf800000;
    local_1974 = 0xbf800000;
    local_1978 = 0xbf800000;
    local_1988 = 0xbf800000bf800000;
    uStack_1980 = 0xbf800000;
    local_2048 = 0xbf800000bf800000;
    uStack_2040 = 0xbf800000;
    local_1e00 = &local_2038;
    local_1290 = &local_1a88;
    local_1028 = 0xbf800000bf800000;
    uStack_1020 = 0xbf800000;
    local_1038 = 0xbf800000bf800000;
    uStack_1030 = 0xbf800000;
    local_1288 = 0x3f800000;
    uStack_1284 = 0x3f800000;
    uStack_1280 = 0x3f800000;
    uStack_127c = 0;
    local_5f8 = 0x3f8000003f800000;
    uStack_5f0 = 0x3f800000;
    local_5e8 = &local_628;
    local_528 = &local_638;
    local_3a8 = 0x3f8000003f800000;
    uStack_3a0 = 0x3f8000003f800000;
    local_4f8 = &local_648;
    local_408 = 0x3f8000003f800000;
    uStack_400 = 0x3f8000003f800000;
    local_418 = &local_668;
    local_388 = 0x40000000;
    uStack_384 = 0x40000000;
    uStack_380 = 0x40000000;
    uStack_37c = 0x3f800000;
    local_3f8 = 0x4000000040000000;
    uStack_3f0 = 0x3f80000040000000;
    local_5e0 = &local_658;
    local_17cc = 0x40400000;
    uStack_3e4 = 0x40400000;
    uStack_3e0 = 0x40400000;
    uStack_3dc = 0x40000000;
    local_608 = 0x4040000040400000;
    uStack_600 = 0x4000000040400000;
    local_1788 = ZEXT416(0x40400000);
    local_17e8 = 0x40400000;
    uStack_17e0 = 0;
    local_16a8 = 0x40400000;
    uStack_16a0 = 0;
    local_17f8 = rsqrtss(ZEXT816(0x40400000),ZEXT816(0x40400000));
    local_178c = 0x3fc00000;
    local_17a8 = ZEXT416(0x3fc00000);
    local_1598 = local_17f8._0_8_;
    uVar1 = local_1598;
    uStack_1590 = local_17f8._8_8_;
    local_1598._0_4_ = local_17f8._0_4_;
    local_1588 = (ulong)(uint)((float)local_1598 * 1.5);
    uStack_1580 = 0;
    local_17ac = 0xbf000000;
    local_17c8 = ZEXT416(0xbf000000);
    local_15b8 = local_17c8._0_8_;
    uStack_15b0 = 0;
    local_15a8 = 0xbfc00000;
    uStack_15a0 = 0;
    local_15d8 = local_17f8._0_8_;
    uStack_15d0 = local_17f8._8_8_;
    local_15c8 = (ulong)(uint)((float)local_1598 * -1.5);
    uStack_15c0 = 0;
    local_15f8 = local_17f8._0_8_;
    uStack_15f0 = local_17f8._8_8_;
    local_15e8 = CONCAT44(local_17f8._4_4_,(float)local_1598 * (float)local_1598);
    uStack_15e0 = local_17f8._8_8_;
    local_1618 = local_15e8;
    uStack_1610 = local_17f8._8_8_;
    local_1c1c = (float)local_1598 * -1.5 * (float)local_1598 * (float)local_1598;
    local_1608 = (ulong)(uint)local_1c1c;
    uStack_1600 = 0;
    local_1678 = local_1608;
    uStack_1670 = 0;
    local_1c1c = (float)local_1598 * 1.5 + local_1c1c;
    local_1668 = (ulong)(uint)local_1c1c;
    uStack_1660 = 0;
    local_1808 = local_1668;
    uStack_1800 = 0;
    local_1438 = local_1668;
    uStack_1430 = 0;
    local_1c00 = &local_1c38;
    local_10b8 = CONCAT44(local_1c1c,local_1c1c);
    uStack_10b0 = CONCAT44(local_1c1c,local_1c1c);
    local_10a8 = 0xbf800000bf800000;
    uStack_10a0 = 0xbf800000;
    local_11c8 = local_1c1c * -1.0;
    fStack_11c4 = local_1c1c * -1.0;
    fStack_11c0 = local_1c1c * -1.0;
    fStack_11bc = local_1c1c * 0.0;
    uStack_700 = CONCAT44(fStack_11bc,fStack_11c0);
    local_1b58 = &local_1f28;
    local_1b80 = &local_20d8;
    local_1b4c = local_1f18;
    local_818 = local_1b68;
    local_7c4 = local_1f18;
    local_79c = local_1f18;
    local_7b8 = local_1f18;
    fStack_7b4 = local_1f18;
    fStack_7b0 = local_1f18;
    fStack_7ac = local_1f18;
    local_808._0_4_ = (float)local_1f28;
    local_808._4_4_ = (float)((ulong)local_1f28 >> 0x20);
    uStack_800._0_4_ = (float)uStack_1f20;
    uStack_800._4_4_ = (float)(uStack_1f20 >> 0x20);
    local_7e8 = local_1f18 * (float)local_808;
    fStack_7e4 = local_1f18 * local_808._4_4_;
    fStack_7e0 = local_1f18 * (float)uStack_800;
    fStack_7dc = local_1f18 * uStack_800._4_4_;
    local_1408 = CONCAT44(fStack_7e4,local_7e8);
    uStack_1400 = CONCAT44(fStack_7dc,fStack_7e0);
    local_1b70 = &local_20c8;
    local_1b78 = &local_1f38;
    local_13f8._0_4_ = (float)local_1f38;
    local_13f8._4_4_ = (float)((ulong)local_1f38 >> 0x20);
    uStack_13f0._0_4_ = (float)uStack_1f30;
    uStack_13f0._4_4_ = (float)(uStack_1f30 >> 0x20);
    local_838 = (float)local_13f8 + local_7e8;
    fStack_834 = local_13f8._4_4_ + fStack_7e4;
    fStack_830 = (float)uStack_13f0 + fStack_7e0;
    fStack_82c = uStack_13f0._4_4_ + fStack_7dc;
    local_1368 = CONCAT44(fStack_834,local_838);
    uStack_1360 = CONCAT44(fStack_82c,fStack_830);
    local_73c = 0x80000000;
    local_71c = 0x80000000;
    local_720 = 0x80000000;
    local_724 = 0x80000000;
    local_728 = 0x80000000;
    local_798 = 0x8000000080000000;
    uStack_790 = 0x8000000080000000;
    local_778 = -local_11c8;
    fStack_774 = -fStack_11c4;
    uStack_770 = uStack_700 ^ 0x8000000080000000;
    local_1d10 = &inf;
    local_1e08 = local_1e90;
    local_1dc8 = local_1e70;
    local_1dc0 = local_1e78;
    local_1c18 = local_1e90;
    local_1c10 = local_1e00;
    local_1c04 = local_1c1c;
    local_1ba0 = local_1c80;
    local_1b98 = local_1dd0;
    local_1b48 = local_1b80;
    local_1b40 = local_1b70;
    local_1b38 = &local_20b8;
    local_1b30 = local_1e00;
    local_1b28 = local_20e8;
    local_1a78 = local_1e90;
    local_1a70 = local_1e90;
    local_1928 = local_1c1c;
    fStack_1924 = local_1c1c;
    fStack_1920 = local_1c1c;
    fStack_191c = local_1c1c;
    local_190c = local_1c1c;
    local_176c = local_17cc;
    local_1598 = uVar1;
    local_13f8 = local_1f38;
    uStack_13f0 = uStack_1f30;
    local_1350 = &local_20b8;
    local_12f0 = local_1e78;
    local_12a0 = local_1e90;
    local_1298 = local_1e90;
    local_1278 = local_1290;
    local_1240 = local_1b88;
    local_1238 = local_1c80;
    local_1230 = local_1dd0;
    local_1218 = local_1dd0;
    local_11e0 = local_1c00;
    local_11d8 = local_1e90;
    local_11d0 = local_1e00;
    local_11b8 = local_1e00;
    local_1068 = local_2008;
    uStack_1060 = uStack_2000;
    local_828 = local_1b70;
    local_820 = local_1b58;
    local_810 = local_1b80;
    local_808 = local_1f28;
    uStack_800 = uStack_1f20;
    local_7d0 = local_1b80;
    local_7c0 = local_818;
    local_788 = local_1e00;
    local_780 = local_20e8;
    local_760 = local_20e8;
    local_758 = local_798;
    uStack_750 = uStack_790;
    local_738 = local_798;
    uStack_730 = uStack_790;
    local_718 = local_798;
    uStack_710 = uStack_790;
    local_610 = local_1290;
    local_530 = local_5e8;
    local_500 = local_5e8;
    local_420 = local_4f8;
    local_410 = local_5e0;
    local_3e8 = local_17cc;
    local_3d8 = local_5e0;
    local_3d0 = local_4f8;
    local_3c8 = local_418;
    local_3c0 = local_528;
    local_3b8 = local_5e8;
    local_3b0 = local_418;
    local_398 = local_5f8;
    uStack_390 = uStack_5f0;
    local_378 = local_418;
    local_370 = local_528;
    local_368 = local_5e8;
    local_258 = local_5e8;
    local_250 = local_528;
    local_248 = uStack_1284;
    uStack_244 = uStack_1284;
    uStack_240 = uStack_1284;
    uStack_23c = uStack_1284;
    local_238 = local_3a8;
    uStack_230 = uStack_3a0;
    local_228 = local_528;
    local_220 = local_5e8;
    local_1c8 = local_5f8;
    uStack_1c0 = uStack_5f0;
    local_158 = local_5e8;
    local_150 = local_4f8;
    local_148 = uStack_1280;
    uStack_144 = uStack_1280;
    uStack_140 = uStack_1280;
    uStack_13c = uStack_1280;
    local_138 = local_408;
    uStack_130 = uStack_400;
    local_128 = local_4f8;
    local_120 = local_5e8;
    local_118 = local_5f8;
    uStack_110 = uStack_5f0;
    uStack_20e0 = uStack_770;
    local_20d8 = local_1408;
    uStack_20d0 = uStack_1400;
    local_20c8 = local_1368;
    uStack_20c0 = uStack_1360;
    local_20b8 = local_1368;
    uStack_20b0 = uStack_1360;
    uStack_2030 = uStack_700;
    local_2028 = local_13a8;
    uStack_2020 = uStack_13a0;
    uStack_1ff0 = uStack_2010;
    local_1c38 = local_10b8;
    uStack_1c30 = uStack_10b0;
    local_1a88 = local_5f8;
    uStack_1a80 = uStack_5f0;
    local_668 = local_3f8;
    uStack_660 = uStack_3f0;
    local_658 = local_608;
    uStack_650 = uStack_600;
    local_648 = local_408;
    uStack_640 = uStack_400;
    local_638 = local_3a8;
    uStack_630 = uStack_3a0;
    local_628 = local_5f8;
    uStack_620 = uStack_5f0;
    local_2038 = local_11c8;
    fStack_2034 = fStack_11c4;
    local_708 = local_11c8;
    fStack_704 = fStack_11c4;
    local_1ff8 = local_1308;
    fStack_1ff4 = fStack_1304;
    local_2018 = local_1308;
    fStack_2014 = fStack_1304;
    local_2088 = std::numeric_limits<float>::infinity();
    local_1cc4 = 1.0 - local_1ecc;
    local_1ca8 = &local_20a8;
    local_1cbc = 0x3a83126f;
    local_1cc8 = 0xffffffff;
    local_1ccc = 0xffffffff;
    local_1cd0 = 0xffffffff;
    local_f2c = 0x3a83126f;
    local_de8 = &local_f48;
    local_dec = 0xffffffff;
    local_df0 = 0xffffffff;
    local_df4 = 0xffffffff;
    local_df8 = 0;
    local_a7c = 0;
    local_a80 = 0xffffffff;
    local_a84 = 0xffffffff;
    local_a88 = 0xffffffff;
    local_a98 = 0xffffffffffffffff;
    uStack_a90 = 0xffffffff;
    local_f48 = 0xffffffffffffffff;
    uStack_f40 = 0xffffffff;
    local_d28 = 0xffffffffffffffff;
    uStack_d20 = 0xffffffff;
    local_d78 = &local_f68;
    local_f68 = 0xffffffffffffffff;
    uStack_f60 = 0xffffffff;
    local_c48 = local_20b8;
    uStack_ba0 = uStack_20b0;
    local_d80 = &local_f78;
    local_d88 = &local_f88;
    local_b24 = 0x3a83126f;
    local_b08 = 0x3a83126f;
    local_b18 = 0x3a83126f;
    uStack_b14 = 0x3a83126f;
    uStack_b10 = 0x3a83126f;
    uStack_b0c = 0x3a83126f;
    local_898 = 0x3a83126f3a83126f;
    uStack_890 = 0x3a83126f3a83126f;
    local_d70 = &local_f58;
    local_988 = 0xffffffffffffffff;
    uStack_980 = 0xffffffff;
    uStack_a00 = uStack_20b0 & 0xffffffff;
    local_888 = 0xffffffffffffffff;
    uStack_880 = 0xffffffff;
    local_a18 = 0;
    uStack_a10 = 0x3a83126f00000000;
    uStack_c40 = uStack_a00 | 0x3a83126f00000000;
    local_f90 = local_2098;
    local_dd0 = &local_fb8;
    local_dd4 = 0xffffffff;
    local_dd8 = 0xffffffff;
    local_ddc = 0xffffffff;
    local_de0 = 0;
    local_a9c = 0;
    local_aa0 = 0xffffffff;
    local_aa4 = 0xffffffff;
    local_aa8 = 0xffffffff;
    local_ab8 = 0xffffffffffffffff;
    uStack_ab0 = 0xffffffff;
    local_fb8 = 0xffffffffffffffff;
    uStack_fb0 = 0xffffffff;
    local_d18 = 0xffffffffffffffff;
    uStack_d10 = 0xffffffff;
    local_d58 = &local_fd8;
    local_fd8 = 0xffffffffffffffff;
    uStack_fd0 = 0xffffffff;
    uStack_b80 = uStack_20e0;
    local_d60 = local_fe8;
    local_d68 = &local_ff8;
    local_8b8 = CONCAT44(local_1cc4,local_1cc4);
    uStack_8b0 = CONCAT44(local_1cc4,local_1cc4);
    local_d50 = local_fc8;
    local_9a8 = 0xffffffffffffffff;
    uStack_9a0 = 0xffffffff;
    uStack_a20 = uStack_20e0 & 0xffffffff;
    local_8a8 = 0xffffffffffffffff;
    uStack_8a0 = 0xffffffff;
    local_a38 = 0;
    uStack_a34 = 0;
    uStack_a30 = 0;
    uStack_c60 = uStack_a20 | (ulong)(uint)local_1cc4 << 0x20;
    local_c50 = local_fc8;
    local_ac0 = local_fc8;
    local_2084 = 0xffffffff;
    local_e38 = auStack_2078;
    local_2064 = 0xffffffff;
    local_2060 = 0xffffffff;
    local_205c = 0xffffffff;
    local_2058 = 0xffffffff;
    local_1b20 = &local_2108;
    local_2108 = 0;
    local_2100 = 0;
    local_20f8 = 0;
    local_20f0 = 0;
    local_2104 = 3;
    local_1b18 = &local_20a8;
    local_1cc0 = local_2088;
    local_1cb8 = local_20e8;
    local_1cb0 = &local_20b8;
    local_f9c = local_1cc4;
    local_f98 = local_20e8;
    local_f28 = &local_20b8;
    local_f20 = local_1ca8;
    local_cf8 = local_de8;
    local_cf0 = local_dd0;
    local_ca8 = local_d28;
    uStack_ca0 = uStack_d20;
    local_c90 = local_d78;
    local_c88 = local_d18;
    uStack_c80 = uStack_d10;
    local_c70 = local_d58;
    local_c30 = local_d70;
    local_ba8 = local_c48;
    local_b90 = local_d80;
    local_b70 = local_d60;
    local_b20 = local_d88;
    local_b04 = local_1cc4;
    local_b00 = local_d68;
    local_af8 = local_1cc4;
    fStack_af4 = local_1cc4;
    fStack_af0 = local_1cc4;
    fStack_aec = local_1cc4;
    local_adc = local_1cc4;
    local_ac8 = local_d70;
    fStack_a2c = local_1cc4;
    local_a08 = local_c48;
    uStack_9b0 = uStack_b80;
    local_998 = local_c48;
    uStack_990 = uStack_ba0;
    local_938 = local_d58;
    local_930 = local_d58;
    local_928 = local_d78;
    local_920 = local_d78;
    local_8f8 = local_d68;
    local_8f0 = local_d60;
    local_8e8 = local_d88;
    local_8e0 = local_d80;
    local_20a8 = local_c48;
    uStack_20a0 = uStack_c40;
    uStack_2090 = uStack_c60;
    local_ff8 = local_8b8;
    uStack_ff0 = uStack_8b0;
    uStack_fe0 = uStack_b80;
    uStack_fc0 = uStack_c60;
    local_f88 = local_898;
    uStack_f80 = uStack_890;
    local_f78 = local_c48;
    uStack_f70 = uStack_ba0;
    local_f58 = local_c48;
    uStack_f50 = uStack_c40;
    rtcTraversableOccluded1(*(undefined8 *)(local_1ea8 + 8),local_1b18,&local_2108);
    *in_stack_00000010 = *in_stack_00000010 + 1;
    if (0.0 <= local_2088) {
      fVar2 = local_1f08 * local_1f08 + local_1f04 * local_1f04 + local_1f00 * local_1f00;
      auVar3 = rsqrtss(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
      local_1458 = auVar3._0_4_;
      fStack_1000 = (float)uStack_2030;
      fVar2 = -(local_2038 *
                local_1f08 *
                (local_1458 * 1.5 + fVar2 * -0.5 * local_1458 * local_1458 * local_1458) +
                fStack_2034 * local_70 + fStack_1000 * local_74);
      local_21b4 = 1.0;
      if (fVar2 < 1.0) {
        local_21b4 = fVar2;
      }
      local_21b8 = 0.0;
      if (0.0 <= local_21b4) {
        local_21b8 = local_21b4;
      }
      local_1088 = (float)local_2008;
      fStack_1084 = (float)((ulong)local_2008 >> 0x20);
      fStack_1080 = (float)uStack_2000;
      fStack_1370 = (float)uStack_1ff0;
      local_1ff8 = local_1ff8 + local_1088 * local_21b8;
      fStack_1ff4 = fStack_1ff4 + fStack_1084 * local_21b8;
      uStack_1ff0 = (ulong)(uint)(fStack_1370 + fStack_1080 * local_21b8);
    }
  }
  local_21bc = 1.0;
  if (local_1ff8 < 1.0) {
    local_21bc = local_1ff8;
  }
  local_21c0 = 0.0;
  if (0.0 <= local_21bc) {
    local_21c0 = local_21bc;
  }
  local_21c4 = 1.0;
  if (fStack_1ff4 < 1.0) {
    local_21c4 = fStack_1ff4;
  }
  local_21c8 = 0.0;
  if (0.0 <= local_21c4) {
    local_21c8 = local_21c4;
  }
  local_21cc = 1.0;
  if ((float)uStack_1ff0 < 1.0) {
    local_21cc = (float)uStack_1ff0;
  }
  local_21d0 = 0.0;
  if (0.0 <= local_21cc) {
    local_21d0 = local_21cc;
  }
  *(int *)(local_1eb8 + (ulong)(uint)(local_1eb0 * local_1ebc + local_1eac) * 4) =
       (int)(long)(local_21d0 * 255.0) * 0x10000 + (int)(long)(local_21c8 * 255.0) * 0x100 +
       (int)(long)(local_21c0 * 255.0);
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  uint32_t state = doodle(x + y * width);
  state = doodle(state);
  float t = doodlef(state);
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, t);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID) // || ray.instID[0] != RTC_INVALID_GEOMETRY_ID)
  {
    Vec3fa diffuse = data.face_colors[ray.primID];
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 1.f - t);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-dot(lightDir,normalize(ray.Ng)),0.0f,1.0f);
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}